

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

ArchKind __thiscall llvm::AArch64::getCPUArchKind(AArch64 *this,StringRef CPU)

{
  bool bVar1;
  AlignedCharArray<4UL,_4UL> AVar2;
  int iVar3;
  ArchKind *pAVar4;
  AlignedCharArray<4UL,_4UL> AVar5;
  char *pcVar6;
  bool bVar7;
  Optional<llvm::AArch64::ArchKind> local_38;
  
  pcVar6 = CPU.Data;
  if ((pcVar6 == (char *)0x7) && (iVar3 = bcmp(this,"generic",7), iVar3 == 0)) {
    return ARMV8A;
  }
  AVar5.buffer[0] = '\x01';
  AVar5.buffer[1] = '\0';
  AVar5.buffer[2] = '\0';
  AVar5.buffer[3] = '\0';
  local_38.Storage.hasVal = false;
  if (pcVar6 == (char *)0xa) {
    iVar3 = bcmp(this,"cortex-a35",10);
    if (iVar3 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
      local_38.Storage.hasVal = true;
      bVar1 = true;
      goto LAB_0018d208;
    }
    iVar3 = bcmp(this,"cortex-a53",10);
    bVar7 = false;
    bVar1 = false;
    if (iVar3 != 0) goto LAB_0018d210;
LAB_0018d2e2:
    AVar2.buffer[0] = '\x01';
    AVar2.buffer[1] = '\0';
    AVar2.buffer[2] = '\0';
    AVar2.buffer[3] = '\0';
LAB_0018d2f8:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar2.buffer;
    local_38.Storage.hasVal = true;
    bVar1 = true;
LAB_0018d303:
    bVar7 = pcVar6 == (char *)0x9;
    if ((((bVar7 && !bVar1) && (iVar3 = bcmp(this,"exynos-m2",9), iVar3 == 0)) ||
        ((bVar7 && !bVar1 && (iVar3 = bcmp(this,"exynos-m3",9), iVar3 == 0)))) ||
       (((bVar7 && !bVar1 && (iVar3 = bcmp(this,"exynos-m4",9), iVar3 == 0)) ||
        ((pcVar6 == (char *)0x6 && !bVar1 && (iVar3 = bcmp(this,"falkor",6), iVar3 == 0))))))
    goto LAB_0018d407;
    if ((pcVar6 == (char *)0x7 && !bVar1) && (iVar3 = bcmp(this,"saphira",7), iVar3 == 0)) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x04';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      goto LAB_0018d409;
    }
    if (pcVar6 == (char *)0x4 && !bVar1) {
      if (*(int *)this == 0x6f79726b) goto LAB_0018d407;
      goto LAB_0018d416;
    }
    if (pcVar6 == (char *)0xc && !bVar1) {
      iVar3 = bcmp(this,"thunderx2t99",0xc);
      bVar7 = true;
      if (iVar3 == 0) {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x02';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
LAB_0018d50a:
        bVar7 = true;
        local_38.Storage.hasVal = true;
        bVar1 = true;
      }
      goto LAB_0018d41e;
    }
    if (pcVar6 == (char *)0x8 && !bVar1) {
      bVar7 = true;
      if (*(long *)this == 0x787265646e756874) {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x01';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
        goto LAB_0018d50a;
      }
      goto LAB_0018d41e;
    }
    bVar7 = pcVar6 != (char *)0xb;
    if ((bVar7 || bVar1) || (iVar3 = bcmp(this,"thunderxt88",0xb), iVar3 != 0)) goto LAB_0018d41e;
  }
  else {
    bVar1 = false;
LAB_0018d208:
    bVar7 = pcVar6 != (char *)0xa;
LAB_0018d210:
    AVar2.buffer[0] = '\x03';
    AVar2.buffer[1] = '\0';
    AVar2.buffer[2] = '\0';
    AVar2.buffer[3] = '\0';
    if ((!bVar7 && !bVar1) && (iVar3 = bcmp(this,"cortex-a55",10), iVar3 == 0)) goto LAB_0018d2f8;
    if ((((!bVar7 && !bVar1) && (iVar3 = bcmp(this,"cortex-a57",10), iVar3 == 0)) ||
        ((!bVar7 && !bVar1 && (iVar3 = bcmp(this,"cortex-a72",10), iVar3 == 0)))) ||
       ((!bVar7 && !bVar1 && (iVar3 = bcmp(this,"cortex-a73",10), iVar3 == 0)))) goto LAB_0018d2e2;
    if ((!bVar7 && !bVar1) && (iVar3 = bcmp(this,"cortex-a75",10), iVar3 == 0)) goto LAB_0018d2f8;
    if (pcVar6 == (char *)0x7 && !bVar1) {
      iVar3 = bcmp(this,"cyclone",7);
      if (iVar3 == 0) {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
             (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
        AVar2.buffer = (char  [4])local_38.Storage.storage;
        goto LAB_0018d2f8;
      }
      goto LAB_0018d303;
    }
    if ((pcVar6 != (char *)0x9 || bVar1) || (iVar3 = bcmp(this,"exynos-m1",9), iVar3 != 0))
    goto LAB_0018d303;
LAB_0018d407:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x01';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
LAB_0018d409:
    local_38.Storage.hasVal = true;
    bVar1 = true;
LAB_0018d416:
    bVar7 = pcVar6 != (char *)0xb;
LAB_0018d41e:
    if (((bVar7 || bVar1) || (iVar3 = bcmp(this,"thunderxt81",0xb), iVar3 != 0)) &&
       ((bVar7 || bVar1 || (iVar3 = bcmp(this,"thunderxt83",0xb), iVar3 != 0)))) {
      if ((pcVar6 != (char *)0x7 || bVar1) || (iVar3 = bcmp(this,"invalid",7), iVar3 != 0)) {
        if (!bVar1) {
          return INVALID;
        }
        goto LAB_0018d4af;
      }
      AVar5.buffer[0] = '\0';
      AVar5.buffer[1] = '\0';
      AVar5.buffer[2] = '\0';
      AVar5.buffer[3] = '\0';
    }
  }
  local_38.Storage.hasVal = true;
  local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
       (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar5.buffer;
LAB_0018d4af:
  pAVar4 = Optional<llvm::AArch64::ArchKind>::getPointer(&local_38);
  return *pAVar4;
}

Assistant:

AArch64::ArchKind llvm::AArch64::getCPUArchKind(StringRef CPU) {
  if (CPU == "generic")
    return AArch64::ArchKind::ARMV8A;

  return StringSwitch<AArch64::ArchKind>(CPU)
#define AARCH64_CPU_NAME(NAME, ID, DEFAULT_FPU, IS_DEFAULT, DEFAULT_EXT) \
  .Case(NAME, AArch64::ArchKind:: ID)
#include "llvm/Support/AArch64TargetParser.def"
    .Default(AArch64::ArchKind::INVALID);
}